

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O1

CURLcode Curl_loadhostpairs(Curl_easy *data)

{
  curl_slist *pcVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  ulong uVar6;
  Curl_addrinfo *pCVar7;
  void *pvVar8;
  Curl_dns_entry *pCVar9;
  uint uVar10;
  char *pcVar11;
  char *pcVar12;
  char *__s;
  Curl_addrinfo *pCVar13;
  bool bVar14;
  int port;
  char address [64];
  char hostname [256];
  uint local_1a4;
  Curl_addrinfo *local_1a0;
  char *local_198;
  Curl_easy *local_190;
  char *local_188;
  Curl_addrinfo *local_180;
  char local_178 [64];
  char local_138 [264];
  
  local_1a4 = 0;
  pcVar1 = (data->change).resolve;
  do {
    if (pcVar1 == (curl_slist *)0x0) {
      (data->change).resolve = (curl_slist *)0x0;
      return CURLE_OK;
    }
    pcVar3 = pcVar1->data;
    if (pcVar3 != (char *)0x0) {
      if (*pcVar3 == '-') {
        iVar2 = __isoc99_sscanf(pcVar3 + 1,"%255[^:]:%d",local_138,&local_1a4);
        if (iVar2 == 2) {
          pcVar3 = create_hostcache_id(local_138,local_1a4);
          if (pcVar3 == (char *)0x0) {
            bVar14 = true;
          }
          else {
            sVar4 = strlen(pcVar3);
            if (data->share != (Curl_share *)0x0) {
              Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
            }
            Curl_hash_delete((data->dns).hostcache,pcVar3,sVar4 + 1);
            if (data->share != (Curl_share *)0x0) {
              Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
            }
            (*Curl_cfree)(pcVar3);
            bVar14 = false;
          }
        }
        else {
          Curl_infof(data,"Couldn\'t parse CURLOPT_RESOLVE removal entry \'%s\'!\n",pcVar1->data);
          bVar14 = false;
        }
        if (bVar14) {
          return CURLE_OUT_OF_MEMORY;
        }
      }
      else {
        pcVar3 = pcVar1->data;
        pcVar5 = strchr(pcVar3,0x3a);
        bVar14 = true;
        if ((pcVar5 == (char *)0x0) || (0xff < (long)pcVar5 - (long)pcVar3)) {
          pcVar3 = (char *)0x0;
          pCVar13 = (Curl_addrinfo *)0x0;
        }
        else {
          memcpy(local_138,pcVar3,(long)pcVar5 - (long)pcVar3);
          pcVar5[(long)(local_138 + -(long)pcVar1->data)] = '\0';
          uVar6 = strtoul(pcVar5 + 1,&local_188,10);
          if (((uVar6 < 0x10000) && (local_188 != pcVar5 + 1)) && (*local_188 == ':')) {
            local_1a4 = (uint)uVar6;
            pcVar3 = local_188 + 1;
            if (*local_188 == '\0') {
              local_1a0 = (Curl_addrinfo *)0x0;
              pcVar5 = local_188;
            }
            else {
              local_1a0 = (Curl_addrinfo *)0x0;
              local_180 = (Curl_addrinfo *)0x0;
              pcVar12 = local_188;
              local_198 = pcVar3;
              local_190 = data;
              do {
                __s = pcVar12 + 1;
                pcVar5 = strchr(__s,0x2c);
                if (pcVar5 == (char *)0x0) {
                  sVar4 = strlen(__s);
                  pcVar5 = __s + sVar4;
                }
                pcVar11 = pcVar5;
                data = local_190;
                pCVar13 = local_1a0;
                pCVar7 = local_180;
                if (*__s == '[') {
                  uVar10 = 5;
                  if ((pcVar5 != __s) && (pcVar5[-1] == ']')) {
                    __s = pcVar12 + 2;
                    pcVar11 = pcVar5 + -1;
                    goto LAB_0010ba71;
                  }
                }
                else {
LAB_0010ba71:
                  uVar6 = (long)pcVar11 - (long)__s;
                  pcVar3 = local_198;
                  if (uVar6 == 0) {
                    uVar10 = 6;
                  }
                  else {
                    uVar10 = 5;
                    if (uVar6 < 0x40) {
                      memcpy(local_178,__s,uVar6);
                      local_178[uVar6] = '\0';
                      pCVar7 = Curl_str2addr(local_178,local_1a4);
                      data = local_190;
                      if (pCVar7 == (Curl_addrinfo *)0x0) {
                        Curl_infof(local_190,"Resolve address \'%s\' found illegal!\n",local_178);
                        pcVar3 = local_198;
                        pCVar13 = local_1a0;
                        pCVar7 = local_180;
                      }
                      else {
                        uVar10 = 0;
                        pcVar3 = local_198;
                        pCVar13 = pCVar7;
                        if (local_180 != (Curl_addrinfo *)0x0) {
                          local_180->ai_next = pCVar7;
                          pCVar13 = local_1a0;
                        }
                      }
                    }
                  }
                }
                local_180 = pCVar7;
                if ((uVar10 != 0) && (uVar10 != 6)) {
                  local_188 = pcVar5;
                  if (uVar10 == 5) goto LAB_0010bb47;
                  goto LAB_0010bcc1;
                }
                pcVar12 = pcVar5;
                local_1a0 = pCVar13;
              } while (*pcVar5 != '\0');
            }
            bVar14 = local_1a0 == (Curl_addrinfo *)0x0;
            pCVar13 = local_1a0;
            local_188 = pcVar5;
          }
          else {
            pcVar3 = (char *)0x0;
            pCVar13 = (Curl_addrinfo *)0x0;
LAB_0010bb47:
            bVar14 = true;
          }
        }
        if (bVar14) {
          Curl_infof(data,"Couldn\'t parse CURLOPT_RESOLVE entry \'%s\'!\n",pcVar1->data);
          Curl_freeaddrinfo(pCVar13);
          uVar10 = 0;
        }
        else {
          local_198 = pcVar3;
          pcVar3 = create_hostcache_id(local_138,local_1a4);
          if (pcVar3 == (char *)0x0) {
            Curl_freeaddrinfo(pCVar13);
            uVar10 = 1;
          }
          else {
            local_1a0 = pCVar13;
            sVar4 = strlen(pcVar3);
            if (data->share != (Curl_share *)0x0) {
              Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
            }
            pvVar8 = Curl_hash_pick((data->dns).hostcache,pcVar3,sVar4 + 1);
            (*Curl_cfree)(pcVar3);
            pcVar3 = local_198;
            pCVar13 = local_1a0;
            if (pvVar8 == (void *)0x0) {
              pCVar9 = Curl_cache_addr(data,local_1a0,local_138,local_1a4);
              pcVar3 = local_198;
              if (pCVar9 == (Curl_dns_entry *)0x0) {
                bVar14 = true;
              }
              else {
                pCVar9->timestamp = 0;
                pCVar9->inuse = pCVar9->inuse + -1;
                bVar14 = false;
              }
            }
            else {
              bVar14 = false;
              Curl_infof(data,"RESOLVE %s:%d is already cached, %s not stored!\n",local_138,
                         (ulong)local_1a4,local_198);
              pCVar13 = local_1a0;
              Curl_freeaddrinfo(local_1a0);
            }
            if (data->share != (Curl_share *)0x0) {
              Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
            }
            if (bVar14) {
              Curl_freeaddrinfo(pCVar13);
              uVar10 = 1;
            }
            else {
              uVar10 = 0;
              Curl_infof(data,"Added %s:%d:%s to DNS cache\n",local_138,(ulong)local_1a4,pcVar3);
            }
          }
        }
LAB_0010bcc1:
        if ((uVar10 & 3) != 0) {
          return CURLE_OUT_OF_MEMORY;
        }
      }
    }
    pcVar1 = pcVar1->next;
  } while( true );
}

Assistant:

CURLcode Curl_loadhostpairs(struct Curl_easy *data)
{
  struct curl_slist *hostp;
  char hostname[256];
  int port = 0;

  for(hostp = data->change.resolve; hostp; hostp = hostp->next) {
    if(!hostp->data)
      continue;
    if(hostp->data[0] == '-') {
      char *entry_id;
      size_t entry_len;

      if(2 != sscanf(hostp->data + 1, "%255[^:]:%d", hostname, &port)) {
        infof(data, "Couldn't parse CURLOPT_RESOLVE removal entry '%s'!\n",
              hostp->data);
        continue;
      }

      /* Create an entry id, based upon the hostname and port */
      entry_id = create_hostcache_id(hostname, port);
      /* If we can't create the entry id, fail */
      if(!entry_id) {
        return CURLE_OUT_OF_MEMORY;
      }

      entry_len = strlen(entry_id);

      if(data->share)
        Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

      /* delete entry, ignore if it didn't exist */
      Curl_hash_delete(data->dns.hostcache, entry_id, entry_len + 1);

      if(data->share)
        Curl_share_unlock(data, CURL_LOCK_DATA_DNS);

      /* free the allocated entry_id again */
      free(entry_id);
    }
    else {
      struct Curl_dns_entry *dns;
      Curl_addrinfo *head = NULL, *tail = NULL;
      char *entry_id;
      size_t entry_len;
      char address[64];
      char *addresses = NULL;
      char *addr_begin;
      char *addr_end;
      char *port_ptr;
      char *end_ptr;
      char *host_end;
      unsigned long tmp_port;
      bool error = true;

      host_end = strchr(hostp->data, ':');
      if(!host_end ||
         ((host_end - hostp->data) >= (ptrdiff_t)sizeof(hostname)))
        goto err;

      memcpy(hostname, hostp->data, host_end - hostp->data);
      hostname[host_end - hostp->data] = '\0';

      port_ptr = host_end + 1;
      tmp_port = strtoul(port_ptr, &end_ptr, 10);
      if(tmp_port > USHRT_MAX || end_ptr == port_ptr || *end_ptr != ':')
        goto err;

      port = (int)tmp_port;
      addresses = end_ptr + 1;

      while(*end_ptr) {
        size_t alen;
        Curl_addrinfo *ai;

        addr_begin = end_ptr + 1;
        addr_end = strchr(addr_begin, ',');
        if(!addr_end)
          addr_end = addr_begin + strlen(addr_begin);
        end_ptr = addr_end;

        /* allow IP(v6) address within [brackets] */
        if(*addr_begin == '[') {
          if(addr_end == addr_begin || *(addr_end - 1) != ']')
            goto err;
          ++addr_begin;
          --addr_end;
        }

        alen = addr_end - addr_begin;
        if(!alen)
          continue;

        if(alen >= sizeof(address))
          goto err;

        memcpy(address, addr_begin, alen);
        address[alen] = '\0';

#ifndef ENABLE_IPV6
        if(strchr(address, ':')) {
          infof(data, "Ignoring resolve address '%s', missing IPv6 support.\n",
                address);
          continue;
        }
#endif

        ai = Curl_str2addr(address, port);
        if(!ai) {
          infof(data, "Resolve address '%s' found illegal!\n", address);
          goto err;
        }

        if(tail) {
          tail->ai_next = ai;
          tail = tail->ai_next;
        }
        else {
          head = tail = ai;
        }
      }

      if(!head)
        goto err;

      error = false;
   err:
      if(error) {
        infof(data, "Couldn't parse CURLOPT_RESOLVE entry '%s'!\n",
              hostp->data);
        Curl_freeaddrinfo(head);
        continue;
      }

      /* Create an entry id, based upon the hostname and port */
      entry_id = create_hostcache_id(hostname, port);
      /* If we can't create the entry id, fail */
      if(!entry_id) {
        Curl_freeaddrinfo(head);
        return CURLE_OUT_OF_MEMORY;
      }
      entry_len = strlen(entry_id);

      if(data->share)
        Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

      /* See if its already in our dns cache */
      dns = Curl_hash_pick(data->dns.hostcache, entry_id, entry_len + 1);

      /* free the allocated entry_id again */
      free(entry_id);

      if(!dns) {
        /* if not in the cache already, put this host in the cache */
        dns = Curl_cache_addr(data, head, hostname, port);
        if(dns) {
          dns->timestamp = 0; /* mark as added by CURLOPT_RESOLVE */
          /* release the returned reference; the cache itself will keep the
           * entry alive: */
          dns->inuse--;
        }
      }
      else {
        /* this is a duplicate, free it again */
        infof(data, "RESOLVE %s:%d is already cached, %s not stored!\n",
              hostname, port, addresses);
        Curl_freeaddrinfo(head);
      }

      if(data->share)
        Curl_share_unlock(data, CURL_LOCK_DATA_DNS);

      if(!dns) {
        Curl_freeaddrinfo(head);
        return CURLE_OUT_OF_MEMORY;
      }
      infof(data, "Added %s:%d:%s to DNS cache\n",
            hostname, port, addresses);
    }
  }
  data->change.resolve = NULL; /* dealt with now */

  return CURLE_OK;
}